

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3PcacheMakeClean(PgHdr *p)

{
  undefined2 uVar1;
  
  if ((p->flags & 2) != 0) {
    pcacheManageDirtyList(p,'\x01');
    uVar1 = p->flags;
    p->flags = (uVar1 & 0xfff0) + 1;
    if ((p->nRef == 0) && (p->pCache->bPurgeable != '\0')) {
      (*sqlite3Config.pcache2.xUnpin)(p->pCache->pCache,p->pPage,0);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheMakeClean(PgHdr *p){
  assert( sqlite3PcachePageSanity(p) );
  if( ALWAYS((p->flags & PGHDR_DIRTY)!=0) ){
    assert( (p->flags & PGHDR_CLEAN)==0 );
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_REMOVE);
    p->flags &= ~(PGHDR_DIRTY|PGHDR_NEED_SYNC|PGHDR_WRITEABLE);
    p->flags |= PGHDR_CLEAN;
    pcacheTrace(("%p.CLEAN %d\n",p->pCache,p->pgno));
    assert( sqlite3PcachePageSanity(p) );
    if( p->nRef==0 ){
      pcacheUnpin(p);
    }
  }
}